

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O3

void __thiscall sf2cute::RIFF::RIFF(RIFF *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_48;
  
  this->_vptr_RIFF = (_func_int **)&PTR__RIFF_0011e980;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->chunks_).
  super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunks_).
  super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunks_).
  super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  set_name(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

RIFF::RIFF(std::string name) {
  set_name(std::move(name));
}